

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QtPrivate::QCalendarTextNavigator::createDateLabel(QCalendarTextNavigator *this)

{
  QWidget *parent;
  QWidget *this_00;
  void *pvVar1;
  QString *format;
  long in_RDI;
  long in_FS_OFFSET;
  QVBoxLayout *vl;
  undefined4 in_stack_ffffffffffffff48;
  ColorRole in_stack_ffffffffffffff4c;
  QCalendarDateValidator *this_01;
  undefined1 enabled;
  QFrame *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  QFlagsStorage<Qt::WindowType> f;
  QCalendar cal;
  QLayout *in_stack_ffffffffffffff80;
  QWidget *in_stack_ffffffffffffff88;
  QDate date;
  QLocale local_40;
  undefined1 local_38 [24];
  QLocale local_20;
  undefined1 local_14 [4];
  undefined1 local_10 [4];
  undefined1 local_c [4];
  long local_8;
  
  f.i = (Int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x18) == 0) {
    parent = (QWidget *)operator_new(0x28);
    this_01 = *(QCalendarDateValidator **)(in_RDI + 0x30);
    memset(local_c,0,4);
    QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x517e48);
    QFrame::QFrame(in_stack_ffffffffffffff60,parent,(WindowFlags)f.i);
    *(QWidget **)(in_RDI + 0x18) = parent;
    this_00 = (QWidget *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_01);
    pvVar1 = operator_new(0x28);
    memset(local_10,0,4);
    QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x517ebd);
    QLabel::QLabel((QLabel *)this_00,parent,
                   (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)pvVar1 >> 0x20,0));
    *(void **)(in_RDI + 0x10) = pvVar1;
    memset(local_14,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x517f14);
    QBoxLayout::addWidget
              ((QBoxLayout *)this_01,
               (QWidget *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)parent >> 0x20,0));
    QWidget::setLayout(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    QFrame::setFrameShadow((QFrame *)this_00,(Shadow)((ulong)parent >> 0x20));
    QFrame::setFrameShape((QFrame *)this_00,(Shape)((ulong)parent >> 0x20));
    format = (QString *)operator_new(0xb0);
    QCalendarDateValidator::QCalendarDateValidator(this_01);
    *(QString **)(in_RDI + 0x28) = format;
    date.jd = *(undefined8 *)(in_RDI + 0x28);
    QWidget::locale(parent);
    QCalendarDateValidator::setLocale
              (this_01,(QLocale *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QLocale::~QLocale(&local_20);
    QWidget::locale(parent);
    enabled = (undefined1)((ulong)parent >> 0x38);
    QLocale::dateFormat((FormatType)local_38);
    QCalendarDateValidator::setFormat((QCalendarDateValidator *)date.jd,format);
    cal = SUB81(format,0);
    QString::~QString((QString *)0x518015);
    QLocale::~QLocale(&local_40);
    QCalendarDateValidator::setInitialDate
              ((QCalendarDateValidator *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),date,cal);
    QWidget::setAutoFillBackground(this_00,(bool)enabled);
    QWidget::setBackgroundRole((QWidget *)this_01,in_stack_ffffffffffffff4c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarTextNavigator::createDateLabel()
{
    if (m_dateFrame)
        return;
    m_dateFrame = new QFrame(m_widget);
    QVBoxLayout *vl = new QVBoxLayout;
    m_dateText = new QLabel;
    vl->addWidget(m_dateText);
    m_dateFrame->setLayout(vl);
    m_dateFrame->setFrameShadow(QFrame::Plain);
    m_dateFrame->setFrameShape(QFrame::Box);
    m_dateValidator = new QCalendarDateValidator();
    m_dateValidator->setLocale(m_widget->locale());
    m_dateValidator->setFormat(m_widget->locale().dateFormat(QLocale::ShortFormat));
    m_dateValidator->setInitialDate(m_date, m_calendar);

    m_dateFrame->setAutoFillBackground(true);
    m_dateFrame->setBackgroundRole(QPalette::Window);
}